

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceObjectArchive::Serialize(DeviceObjectArchive *this,IDataBlob **ppDataBlob)

{
  SerializedData *pSVar1;
  RefCntAutoPtr<Diligent::DataBlobImpl> RVar2;
  undefined8 uVar3;
  bool bVar4;
  TEnable<unsigned_int> TVar5;
  TEnable<unsigned_int> TVar6;
  uint uVar7;
  size_t sVar8;
  void *pData;
  DeviceObjectArchive *Args_1;
  __node_base *p_Var9;
  SerializedData *Shader;
  SerializedData *pSVar10;
  __node_base *p_Var11;
  long lVar12;
  string msg;
  RefCntAutoPtr<Diligent::DataBlobImpl> pDataBlob;
  Serializer<(Diligent::SerializerMode)1> Writer;
  undefined8 local_78;
  undefined1 local_70 [24];
  Uint32 NumResources;
  undefined4 uStack_54;
  ResourceType ResType_1;
  Uint32 NumResources_1;
  Serializer<(Diligent::SerializerMode)2> Measurer;
  
  if (ppDataBlob == (IDataBlob **)0x0) {
    FormatString<char[49]>(&msg,(char (*) [49])"Pointer to the data blob object must not be null");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Serialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
               ,0xf3);
    std::__cxx11::string::~string((string *)&msg);
  }
  else {
    if (*ppDataBlob != (IDataBlob *)0x0) {
      FormatString<char[30]>(&msg,(char (*) [30])"Data blob object must be null");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"Serialize",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                 ,0xf6);
      std::__cxx11::string::~string((string *)&msg);
    }
    Measurer.m_Start = (TPointer)0x0;
    Measurer.m_End = (TPointer)0xffffffff;
    Measurer.m_Ptr = (TPointer)0x0;
    local_78 = (Char *)0x8de00000a;
    local_70._0_4_ = 0x3e808;
    local_70._8_8_ = "9c77d7ae";
    local_70._4_4_ = this->m_ContentVersion;
    bVar4 = Serializer<(Diligent::SerializerMode)2>::operator()
                      (&Measurer,(uint *)&local_78,(uint *)((long)&local_78 + 4),(uint *)local_70,
                       (uint *)(local_70 + 4),(char **)(local_70 + 8));
    if (!bVar4) {
      FormatString<char[27]>(&msg,(char (*) [27])"Failed to serialize header");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"operator()",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                 ,0x100);
      std::__cxx11::string::~string((string *)&msg);
    }
    msg._M_dataplus._M_p = (pointer)(this->m_NamedResources)._M_h._M_element_count;
    uVar7 = StaticCast<unsigned_int,unsigned_long>((unsigned_long *)&msg);
    _NumResources = (_Hash_node_base *)CONCAT44(uStack_54,uVar7);
    TVar5 = Serializer<(Diligent::SerializerMode)2>::Serialize<unsigned_int>
                      (&Measurer,&NumResources);
    if (!TVar5) {
      FormatString<char[44]>(&msg,(char (*) [44])"Failed to serialize the number of resources");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"operator()",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                 ,0x104);
      std::__cxx11::string::~string((string *)&msg);
    }
    p_Var9 = &(this->m_NamedResources)._M_h._M_before_begin;
    p_Var11 = p_Var9;
    local_70._16_8_ = ppDataBlob;
LAB_005a2ac4:
    p_Var11 = p_Var11->_M_nxt;
    if (p_Var11 != (__node_base *)0x0) {
      Writer.m_Start = *(TPointer *)&((_Prime_rehash_policy *)(p_Var11 + 2))->_M_max_load_factor;
      pDataBlob.m_pObject._0_4_ = (int)*(size_type *)(p_Var11 + 1);
      bVar4 = Serializer<(Diligent::SerializerMode)2>::operator()
                        (&Measurer,(ResourceType *)&pDataBlob,(char **)&Writer);
      if (!bVar4) {
        FormatString<char[43]>(&msg,(char (*) [43])"Failed to serialize resource type and name");
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"operator()",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                   ,0x10c);
        std::__cxx11::string::~string((string *)&msg);
      }
      bVar4 = Serializer<(Diligent::SerializerMode)2>::Serialize
                        (&Measurer,(SerializedData *)(p_Var11 + 4));
      if (bVar4) {
        lVar12 = 0;
        do {
          if (lVar12 == 0xe0) goto LAB_005a2ac4;
          bVar4 = Serializer<(Diligent::SerializerMode)2>::Serialize
                            (&Measurer,(SerializedData *)((long)&p_Var11[8]._M_nxt + lVar12));
          lVar12 = lVar12 + 0x20;
        } while (bVar4);
        FormatString<char[34]>(&msg,(char (*) [34])"Failed to serialize resource data");
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"operator()",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                   ,0x10f);
        std::__cxx11::string::~string((string *)&msg);
      }
      goto LAB_005a2ac4;
    }
    for (lVar12 = 0x38; lVar12 != 0xe0; lVar12 = lVar12 + 0x18) {
      msg._M_dataplus._M_p._0_4_ =
           (int)((ulong)(*(long *)((long)((this->m_DeviceShaders)._M_elems + -2) + lVar12) -
                        *(long *)((long)(this->m_DeviceShaders)._M_elems + lVar12 + -0x38)) >> 5);
      TVar5 = Serializer<(Diligent::SerializerMode)2>::Serialize<unsigned_int>
                        (&Measurer,(ConstQual<unsigned_int> *)&msg);
      if (TVar5) {
        pSVar10 = *(SerializedData **)((long)(this->m_DeviceShaders)._M_elems + lVar12 + -0x38);
        pSVar1 = *(SerializedData **)((long)((this->m_DeviceShaders)._M_elems + -2) + lVar12);
        do {
          if (pSVar10 == pSVar1) goto LAB_005a2c3a;
          bVar4 = Serializer<(Diligent::SerializerMode)2>::Serialize(&Measurer,pSVar10);
          pSVar10 = pSVar10 + 1;
        } while (bVar4);
      }
      FormatString<char[28]>(&msg,(char (*) [28])"Failed to serialize shaders");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"operator()",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                 ,0x115);
      std::__cxx11::string::~string((string *)&msg);
LAB_005a2c3a:
    }
    sVar8 = Serializer<(Diligent::SerializerMode)2>::GetSize(&Measurer);
    DataBlobImpl::Create((DataBlobImpl *)&pDataBlob,sVar8,(void *)0x0);
    pData = DataBlobImpl::GetDataPtr(pDataBlob.m_pObject,0);
    sVar8 = DataBlobImpl::GetSize(pDataBlob.m_pObject);
    SerializedData::SerializedData((SerializedData *)&msg,pData,sVar8);
    Writer.m_Start = (TPointer)msg._M_string_length;
    Writer.m_End = (TPointer)(msg.field_2._M_allocated_capacity + msg._M_string_length);
    Writer.m_Ptr = (TPointer)msg._M_string_length;
    SerializedData::~SerializedData((SerializedData *)&msg);
    local_78 = (Char *)0x8de00000a;
    Args_1 = (DeviceObjectArchive *)local_70;
    local_70._0_4_ = 0x3e808;
    local_70._8_8_ = "9c77d7ae";
    local_70._4_4_ = this->m_ContentVersion;
    bVar4 = Serializer<(Diligent::SerializerMode)1>::operator()
                      (&Writer,(uint *)&local_78,(uint *)((long)&local_78 + 4),(uint *)Args_1,
                       (uint *)(local_70 + 4),(char **)(local_70 + 8));
    if (!bVar4) {
      FormatString<char[27]>(&msg,(char (*) [27])"Failed to serialize header");
      Args_1 = (DeviceObjectArchive *)0x100;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"operator()",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                 ,0x100);
      std::__cxx11::string::~string((string *)&msg);
    }
    msg._M_dataplus._M_p = (pointer)(this->m_NamedResources)._M_h._M_element_count;
    NumResources_1 = StaticCast<unsigned_int,unsigned_long>((unsigned_long *)&msg);
    TVar6 = Serializer<(Diligent::SerializerMode)1>::Serialize<unsigned_int>
                      (&Writer,&NumResources_1);
    if (TVar6) goto LAB_005a2e12;
    FormatString<char[44]>(&msg,(char (*) [44])"Failed to serialize the number of resources");
    Args_1 = (DeviceObjectArchive *)0x104;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"operator()",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
               ,0x104);
LAB_005a2e08:
    std::__cxx11::string::~string((string *)&msg);
LAB_005a2e12:
    while (p_Var9 = p_Var9->_M_nxt, p_Var9 != (__node_base *)0x0) {
      _NumResources =
           *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var9 + 2))->_M_max_load_factor;
      ResType_1 = (ResourceType)*(size_type *)(p_Var9 + 1);
      bVar4 = Serializer<(Diligent::SerializerMode)1>::operator()
                        (&Writer,&ResType_1,(char **)&NumResources);
      if (!bVar4) {
        FormatString<char[43]>(&msg,(char (*) [43])"Failed to serialize resource type and name");
        Args_1 = (DeviceObjectArchive *)0x10c;
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"operator()",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                   ,0x10c);
        std::__cxx11::string::~string((string *)&msg);
      }
      bVar4 = Serializer<(Diligent::SerializerMode)1>::Serialize
                        (&Writer,(SerializedData *)(p_Var9 + 4));
      if (bVar4) {
        lVar12 = 0;
        while (lVar12 != 0xe0) {
          bVar4 = Serializer<(Diligent::SerializerMode)1>::Serialize
                            (&Writer,(SerializedData *)((long)&p_Var9[8]._M_nxt + lVar12));
          lVar12 = lVar12 + 0x20;
          if (!bVar4) {
            FormatString<char[34]>(&msg,(char (*) [34])"Failed to serialize resource data");
            Args_1 = (DeviceObjectArchive *)0x10f;
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"operator()",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                       ,0x10f);
            goto LAB_005a2e08;
          }
        }
      }
    }
    for (lVar12 = 0x38; uVar3 = local_70._16_8_, lVar12 != 0xe0; lVar12 = lVar12 + 0x18) {
      msg._M_dataplus._M_p._0_4_ =
           (int)((ulong)(*(long *)((long)((this->m_DeviceShaders)._M_elems + -2) + lVar12) -
                        *(long *)((long)(this->m_DeviceShaders)._M_elems + lVar12 + -0x38)) >> 5);
      Args_1 = this;
      TVar6 = Serializer<(Diligent::SerializerMode)1>::Serialize<unsigned_int>
                        (&Writer,(ConstQual<unsigned_int> *)&msg);
      if (TVar6) {
        pSVar10 = *(SerializedData **)((long)(this->m_DeviceShaders)._M_elems + lVar12 + -0x38);
        pSVar1 = *(SerializedData **)((long)((this->m_DeviceShaders)._M_elems + -2) + lVar12);
        do {
          if (pSVar10 == pSVar1) goto LAB_005a2f87;
          bVar4 = Serializer<(Diligent::SerializerMode)1>::Serialize(&Writer,pSVar10);
          pSVar10 = pSVar10 + 1;
        } while (bVar4);
      }
      FormatString<char[28]>(&msg,(char (*) [28])"Failed to serialize shaders");
      Args_1 = (DeviceObjectArchive *)0x115;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"operator()",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                 ,0x115);
      std::__cxx11::string::~string((string *)&msg);
LAB_005a2f87:
    }
    if (Writer.m_Ptr != Writer.m_End) {
      FormatString<char[26],char[17]>
                (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"Writer.IsEnded()",
                 (char (*) [17])Args_1);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"Serialize",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                 ,0x120);
      std::__cxx11::string::~string((string *)&msg);
    }
    RVar2.m_pObject = pDataBlob.m_pObject;
    pDataBlob.m_pObject = (DataBlobImpl *)0x0;
    *(_Hash_node_base **)uVar3 = (_Hash_node_base *)RVar2.m_pObject;
    RefCntAutoPtr<Diligent::DataBlobImpl>::Release(&pDataBlob);
  }
  return;
}

Assistant:

void DeviceObjectArchive::Serialize(IDataBlob** ppDataBlob) const
{
    if (ppDataBlob == nullptr)
    {
        DEV_ERROR("Pointer to the data blob object must not be null");
        return;
    }
    DEV_CHECK_ERR(*ppDataBlob == nullptr, "Data blob object must be null");

    auto SerializeThis = [this](auto& Ser) {
        constexpr auto SerMode    = std::remove_reference<decltype(Ser)>::type::GetMode();
        const auto     ArchiveSer = ArchiveSerializer<SerMode>{Ser};

        ArchiveHeader Header;
        Header.ContentVersion = m_ContentVersion;

        auto res = ArchiveSer.SerializeHeader(Header);
        VERIFY(res, "Failed to serialize header");

        Uint32 NumResources = StaticCast<Uint32>(m_NamedResources.size());
        res                 = Ser(NumResources);
        VERIFY(res, "Failed to serialize the number of resources");

        for (const auto& res_it : m_NamedResources)
        {
            const auto* Name    = res_it.first.GetName();
            const auto  ResType = res_it.first.GetType();

            res = Ser(ResType, Name);
            VERIFY(res, "Failed to serialize resource type and name");

            res = ArchiveSer.SerializeResourceData(res_it.second);
            VERIFY(res, "Failed to serialize resource data");
        }

        for (auto& Shaders : m_DeviceShaders)
        {
            res = ArchiveSer.SerializeShaders(Shaders);
            VERIFY(res, "Failed to serialize shaders");
        }
    };

    Serializer<SerializerMode::Measure> Measurer;
    SerializeThis(Measurer);

    auto pDataBlob = DataBlobImpl::Create(Measurer.GetSize());

    Serializer<SerializerMode::Write> Writer{SerializedData{pDataBlob->GetDataPtr(), pDataBlob->GetSize()}};
    SerializeThis(Writer);
    VERIFY_EXPR(Writer.IsEnded());

    *ppDataBlob = pDataBlob.Detach();
}